

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  J_COLOR_SPACE JVar5;
  int iVar6;
  int iVar7;
  _func_void_j_decompress_ptr *p_Var8;
  JSAMPARRAY ppJVar9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  uint uVar13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  byte *pbVar28;
  int iVar29;
  long lVar30;
  long *plVar31;
  byte *pbVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  bool bVar42;
  JSAMPLE colorlist [256];
  JLONG mindist [256];
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  p_Var8 = cinfo->cquantize[1].finish_pass;
  uVar23 = c0 * 8 & 0xffffffe0;
  uVar1 = uVar23 + 4;
  uVar19 = c1 * 4 & 0xffffffe0;
  uVar2 = uVar19 + 2;
  uVar13 = c2 * 8 & 0xffffffe0;
  uVar3 = uVar13 + 4;
  lVar17 = (long)cinfo->actual_number_of_colors;
  if (lVar17 < 1) {
    uVar13 = 0;
  }
  else {
    uVar39 = c0 * 8 | 0x1c;
    uVar36 = c1 * 4 | 0x1e;
    uVar33 = c2 * 8 | 0x1c;
    ppJVar9 = cinfo->colormap;
    pJVar10 = *ppJVar9;
    pJVar11 = ppJVar9[1];
    pJVar12 = ppJVar9[2];
    JVar5 = cinfo->out_color_space;
    iVar35 = c_scales[rgb_red[JVar5]];
    iVar6 = c_scales[rgb_green[JVar5]];
    iVar7 = c_scales[rgb_blue[JVar5]];
    lVar14 = 0;
    lVar25 = 0x7fffffff;
    do {
      bVar4 = pJVar10[lVar14];
      uVar26 = (uint)bVar4;
      uVar40 = uVar39;
      if ((int)uVar26 < (int)uVar1) {
        lVar30 = (long)(int)((uVar26 - uVar1) * iVar35);
        lVar30 = lVar30 * lVar30;
      }
      else {
        iVar29 = bVar4 - uVar39;
        if (iVar29 == 0 || (int)(uint)bVar4 < (int)uVar39) {
          if (uVar23 + uVar39 + 4 >> 1 < uVar26) {
            uVar40 = uVar1;
          }
          lVar30 = 0;
        }
        else {
          lVar30 = (long)(iVar29 * iVar35);
          lVar30 = lVar30 * lVar30;
          uVar40 = uVar1;
        }
      }
      bVar4 = pJVar11[lVar14];
      uVar34 = (uint)bVar4;
      uVar37 = uVar36;
      if ((int)uVar34 < (int)uVar2) {
        lVar21 = (long)(int)((uVar34 - uVar2) * iVar6);
        lVar30 = lVar30 + lVar21 * lVar21;
      }
      else {
        iVar29 = bVar4 - uVar36;
        if (iVar29 == 0 || (int)(uint)bVar4 < (int)uVar36) {
          if (uVar19 + uVar36 + 2 >> 1 < uVar34) {
            uVar37 = uVar2;
          }
        }
        else {
          lVar21 = (long)(iVar29 * iVar6);
          lVar30 = lVar30 + lVar21 * lVar21;
          uVar37 = uVar2;
        }
      }
      bVar4 = pJVar12[lVar14];
      uVar20 = (uint)bVar4;
      uVar24 = uVar33;
      if ((int)uVar20 < (int)uVar3) {
        lVar21 = (long)(int)((uVar20 - uVar3) * iVar7);
        lVar30 = lVar30 + lVar21 * lVar21;
      }
      else if (uVar20 - uVar33 == 0 || (int)uVar20 < (int)uVar33) {
        if (uVar13 + uVar33 + 4 >> 1 < (uint)bVar4) {
          uVar24 = uVar3;
        }
      }
      else {
        lVar21 = (long)(int)((uVar20 - uVar33) * iVar7);
        lVar30 = lVar30 + lVar21 * lVar21;
        uVar24 = uVar3;
      }
      lVar27 = (long)(int)((uVar26 - uVar40) * iVar35);
      lVar41 = (long)(int)((uVar34 - uVar37) * iVar6);
      lVar21 = (long)(int)((bVar4 - uVar24) * iVar7);
      lVar21 = lVar21 * lVar21 + lVar41 * lVar41 + lVar27 * lVar27;
      local_838[lVar14] = lVar30;
      if (lVar25 <= lVar21) {
        lVar21 = lVar25;
      }
      lVar14 = lVar14 + 1;
      lVar25 = lVar21;
    } while (lVar17 != lVar14);
    lVar25 = 0;
    uVar13 = 0;
    do {
      if (local_838[lVar25] <= lVar21) {
        lVar14 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        abStack_938[lVar14] = (byte)lVar25;
      }
      lVar25 = lVar25 + 1;
    } while (lVar17 != lVar25);
  }
  lVar17 = 0;
  do {
    local_838[lVar17] = 0x7fffffff;
    local_838[lVar17 + 1] = 0x7fffffff;
    lVar17 = lVar17 + 2;
  } while (lVar17 != 0x80);
  if (0 < (int)uVar13) {
    uVar38 = (ulong)cinfo->out_color_space;
    iVar35 = c_scales[rgb_red[uVar38]];
    uVar16 = 0;
    do {
      bVar4 = abStack_938[uVar16];
      ppJVar9 = cinfo->colormap;
      lVar30 = (long)(int)((uVar1 - (*ppJVar9)[bVar4]) * iVar35);
      iVar6 = c_scales[rgb_green[uVar38]];
      lVar14 = (long)(int)((uVar2 - ppJVar9[1][bVar4]) * iVar6);
      iVar7 = c_scales[rgb_blue[uVar38]];
      lVar17 = (long)(int)((uVar3 - ppJVar9[2][bVar4]) * iVar7);
      lVar25 = lVar17 * lVar17 + lVar14 * lVar14 + lVar30 * lVar30;
      lVar30 = (ulong)(uint)(iVar35 * 8 * iVar35 * 8) + (iVar35 << 4) * lVar30;
      iVar29 = 3;
      pbVar28 = local_9b8;
      plVar31 = local_838;
      do {
        iVar35 = 7;
        lVar21 = lVar25;
        lVar27 = (ulong)(uint)(iVar6 * 4 * iVar6 * 4) + iVar6 * lVar14 * 8;
        do {
          plVar15 = plVar31;
          lVar22 = 0;
          lVar41 = (ulong)(uint)(iVar7 * 8 * iVar7 * 8) + iVar7 * lVar17 * 0x10;
          lVar18 = lVar21;
          do {
            if (lVar18 < *(long *)((long)plVar15 + lVar22)) {
              *(long *)((long)plVar15 + lVar22) = lVar18;
              *pbVar28 = bVar4;
              uVar38 = (ulong)cinfo->out_color_space;
            }
            lVar18 = lVar18 + lVar41;
            lVar41 = lVar41 + c_scales[rgb_blue[uVar38]] * c_scales[rgb_blue[uVar38]] * 0x80;
            pbVar28 = pbVar28 + 1;
            lVar22 = lVar22 + 8;
          } while ((int)lVar22 != 0x20);
          lVar21 = lVar21 + lVar27;
          lVar27 = lVar27 + c_scales[rgb_green[uVar38]] * c_scales[rgb_green[uVar38]] * 0x20;
          bVar42 = iVar35 != 0;
          iVar35 = iVar35 + -1;
          plVar31 = (long *)((long)plVar15 + lVar22);
        } while (bVar42);
        lVar25 = lVar25 + lVar30;
        iVar35 = c_scales[rgb_red[uVar38]];
        lVar30 = lVar30 + iVar35 * iVar35 * 0x80;
        plVar31 = (long *)((long)plVar15 + lVar22);
        bVar42 = iVar29 != 0;
        iVar29 = iVar29 + -1;
      } while (bVar42);
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar13);
  }
  pbVar28 = local_9b8;
  uVar16 = 0;
  do {
    lVar17 = *(long *)(p_Var8 + (uVar16 | (long)(int)(c0 & 0xfffffffc)) * 8) +
             (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
    lVar25 = 0;
    do {
      pbVar32 = pbVar28;
      lVar14 = 0;
      do {
        *(ushort *)(lVar17 + lVar14 * 2) = pbVar32[lVar14] + 1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      lVar25 = lVar25 + 1;
      lVar17 = lVar17 + 0x40;
      pbVar28 = pbVar32 + 4;
    } while (lVar25 != 8);
    uVar16 = uVar16 + 1;
    pbVar28 = pbVar32 + 4;
  } while (uVar16 != 4);
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap(j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;      /* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE *cptr;       /* pointer into bestcolor[] array */
  register histptr cachep;      /* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;                /* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
                   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;            /* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = &histogram[c0 + ic0][c1 + ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
        *cachep++ = (histcell)((*cptr++) + 1);
      }
    }
  }
}